

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_reassoc_bxor(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  
  if (((J->fold).left[0].field_1.t.irt & 0x40) == 0) {
    uVar1 = (J->fold).ins.field_0.op2;
    uVar2 = (J->fold).left[0].field_0.op1;
    uVar3 = (J->fold).left[0].field_0.op2;
    uVar4 = uVar3;
    if ((uVar1 != uVar2) && (uVar4 = uVar2, uVar1 != uVar3)) {
      uVar4 = 0;
    }
  }
  else {
    uVar4 = 0;
  }
  return (TRef)uVar4;
}

Assistant:

LJFOLD(BXOR BXOR any)
LJFOLDF(reassoc_bxor)
{
  PHIBARRIER(fleft);
  if (fins->op2 == fleft->op1)  /* (a xor b) xor a ==> b */
    return fleft->op2;
  if (fins->op2 == fleft->op2)  /* (a xor b) xor b ==> a */
    return fleft->op1;
  return NEXTFOLD;
}